

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBuilderUtil.cpp
# Opt level: O2

ssize_t __thiscall
vk::DescriptorSetUpdateBuilder::write
          (DescriptorSetUpdateBuilder *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  uint in_R8D;
  VkDescriptorImageInfo *in_stack_00000008;
  VkDescriptorBufferInfo *in_stack_00000010;
  Handle<(vk::HandleType)12> *in_stack_00000018;
  undefined1 local_a8 [24];
  pointer pVStack_90;
  const_iterator local_88;
  pointer pVStack_80;
  pointer local_78;
  const_iterator cStack_70;
  pointer local_68;
  value_type local_60;
  
  local_60.dstSet.m_internal = CONCAT44(in_register_00000034,__fd);
  local_60.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
  local_60.pNext = (void *)0x0;
  local_60.dstBinding = (deUint32)__buf;
  local_60.dstArrayElement = (deUint32)__n;
  local_60.pImageInfo = (VkDescriptorImageInfo *)0x0;
  local_60.pBufferInfo = (VkDescriptorBufferInfo *)0x0;
  local_60.pTexelBufferView = (VkBufferView *)0x0;
  std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::push_back
            (&this->m_writes,&local_60);
  local_78 = (pointer)0x0;
  cStack_70._M_current = (Handle<(vk::HandleType)12> *)0x0;
  local_88._M_current = (VkDescriptorBufferInfo *)0x0;
  pVStack_80 = (pointer)0x0;
  local_68 = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  pVStack_90 = (pointer)0x0;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  if (in_stack_00000008 != (VkDescriptorImageInfo *)0x0) {
    std::vector<vk::VkDescriptorImageInfo,std::allocator<vk::VkDescriptorImageInfo>>::
    insert<vk::VkDescriptorImageInfo_const*,void>
              ((vector<vk::VkDescriptorImageInfo,std::allocator<vk::VkDescriptorImageInfo>> *)
               local_a8,(const_iterator)0x0,in_stack_00000008,in_stack_00000008 + in_R8D);
  }
  if (in_stack_00000010 != (VkDescriptorBufferInfo *)0x0) {
    std::vector<vk::VkDescriptorBufferInfo,std::allocator<vk::VkDescriptorBufferInfo>>::
    insert<vk::VkDescriptorBufferInfo_const*,void>
              ((vector<vk::VkDescriptorBufferInfo,std::allocator<vk::VkDescriptorBufferInfo>> *)
               &pVStack_90,local_88,in_stack_00000010,in_stack_00000010 + in_R8D);
  }
  if (in_stack_00000018 != (Handle<(vk::HandleType)12> *)0x0) {
    std::vector<vk::Handle<(vk::HandleType)12>,std::allocator<vk::Handle<(vk::HandleType)12>>>::
    insert<vk::Handle<(vk::HandleType)12>const*,void>
              ((vector<vk::Handle<(vk::HandleType)12>,std::allocator<vk::Handle<(vk::HandleType)12>>>
                *)&local_78,cStack_70,in_stack_00000018,in_stack_00000018 + in_R8D);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::push_back(&this->m_writeDescriptorInfos,(value_type *)local_a8);
  WriteDescriptorInfo::~WriteDescriptorInfo((WriteDescriptorInfo *)local_a8);
  return (ssize_t)this;
}

Assistant:

DescriptorSetUpdateBuilder& DescriptorSetUpdateBuilder::write (VkDescriptorSet					destSet,
															   deUint32							destBinding,
															   deUint32							destArrayElement,
															   deUint32							count,
															   VkDescriptorType					descriptorType,
															   const VkDescriptorImageInfo*		pImageInfo,
															   const VkDescriptorBufferInfo*	pBufferInfo,
															   const VkBufferView*				pTexelBufferView)
{
	// pImageInfo, pBufferInfo and pTexelBufferView will be updated when calling update()
	const VkWriteDescriptorSet writeParams =
	{
		VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
		DE_NULL,
		destSet,			//!< destSet
		destBinding,		//!< destBinding
		destArrayElement,	//!< destArrayElement
		count,				//!< count
		descriptorType,		//!< descriptorType
		DE_NULL,
		DE_NULL,
		DE_NULL
	};

	m_writes.push_back(writeParams);

	// Store a copy of pImageInfo, pBufferInfo and pTexelBufferView
	WriteDescriptorInfo	writeInfo;

	if (pImageInfo)
		writeInfo.imageInfos.insert(writeInfo.imageInfos.end(), pImageInfo, pImageInfo + count);

	if (pBufferInfo)
		writeInfo.bufferInfos.insert(writeInfo.bufferInfos.end(), pBufferInfo, pBufferInfo + count);

	if (pTexelBufferView)
		writeInfo.texelBufferViews.insert(writeInfo.texelBufferViews.end(), pTexelBufferView, pTexelBufferView + count);

	m_writeDescriptorInfos.push_back(writeInfo);

	return *this;
}